

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O0

Var Js::RegexHelper::
    RegexEs6ReplaceImpl<Js::RegexHelper::RegexEs6ReplaceImpl(Js::ScriptContext*,Js::RecyclableObject*,Js::JavascriptString*,Js::RecyclableObject*)::__0>
              (ScriptContext *scriptContext,RecyclableObject *thisObj,JavascriptString *input,
              anon_class_24_3_9375e38d appendReplacement,bool noResult)

{
  code *pcVar1;
  anon_class_80_10_f99f1d2d map;
  JavascriptString *instance;
  bool bVar2;
  BOOL BVar3;
  Var lastIndex;
  Recycler *pRVar4;
  List<Js::RecyclableObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this
  ;
  undefined4 *puVar5;
  CharCount substringLength;
  ArenaAllocator *local_2e8;
  ArenaAllocator *tempAlloc;
  TempArenaAllocatorObject *temptempAlloc;
  Type *captures;
  size_t previousNumberOfCapturesToKeep;
  CharCount nextSourcePosition;
  CharCount inputLength;
  Builder<256U> accumulatedResultBuilder;
  JavascriptString *matchStr;
  RecyclableObject *resultObj;
  Var result;
  PCWSTR varName;
  undefined8 local_70;
  TrackAllocData local_68;
  List<Js::RecyclableObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *local_40;
  List<Js::RecyclableObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *results;
  Recycler *recycler;
  JavascriptString *accumulatedResult;
  bool unicode;
  bool global;
  JavascriptString *pJStack_20;
  bool noResult_local;
  JavascriptString *input_local;
  RecyclableObject *thisObj_local;
  ScriptContext *scriptContext_local;
  
  accumulatedResult._7_1_ = noResult;
  pJStack_20 = input;
  input_local = (JavascriptString *)thisObj;
  thisObj_local = (RecyclableObject *)scriptContext;
  accumulatedResult._6_1_ = JavascriptRegExp::GetGlobalProperty(thisObj,scriptContext);
  accumulatedResult._5_1_ = 0;
  if ((bool)accumulatedResult._6_1_) {
    accumulatedResult._5_1_ =
         JavascriptRegExp::GetUnicodeProperty
                   (&input_local->super_RecyclableObject,(ScriptContext *)thisObj_local);
    instance = input_local;
    lastIndex = TaggedInt::ToVarUnchecked(0);
    JavascriptRegExp::SetLastIndexProperty(instance,lastIndex,(ScriptContext *)thisObj_local);
  }
  recycler = (Recycler *)0x0;
  pRVar4 = ScriptContext::GetRecycler((ScriptContext *)thisObj_local);
  results = (List<Js::RecyclableObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)pRVar4;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_68,
             (type_info *)
             &JsUtil::
              List<Js::RecyclableObject*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>
              ::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
             ,0x3fd);
  pRVar4 = Memory::Recycler::TrackAllocInfo(pRVar4,&local_68);
  varName = (PCWSTR)Memory::Recycler::AllocInlined;
  local_70 = 0;
  this = (List<Js::RecyclableObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *)new<Memory::Recycler>(0x30,pRVar4,0x43c4b0);
  JsUtil::
  List<Js::RecyclableObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::List
            (this,(Recycler *)results,4);
  local_40 = this;
  while( true ) {
    result = anon_var_dwarf_552d26e;
    resultObj = (RecyclableObject *)
                JavascriptRegExp::CallExec
                          (&input_local->super_RecyclableObject,pJStack_20,
                           L"RegExp.prototype[Symbol.replace]",(ScriptContext *)thisObj_local);
    BVar3 = Js::JavascriptOperators::IsNull(resultObj);
    if (BVar3 != 0) break;
    matchStr = (JavascriptString *)ExecResultToRecyclableObject(resultObj);
    JsUtil::
    List<Js::RecyclableObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
    Add(local_40,(RecyclableObject **)&matchStr);
    if ((accumulatedResult._6_1_ & 1) == 0) break;
    accumulatedResultBuilder._544_8_ =
         GetMatchStrFromResult(&matchStr->super_RecyclableObject,(ScriptContext *)thisObj_local);
    AdvanceLastIndex(&input_local->super_RecyclableObject,pJStack_20,
                     (JavascriptString *)accumulatedResultBuilder._544_8_,
                     (bool)(accumulatedResult._5_1_ & 1),(ScriptContext *)thisObj_local);
  }
  CompoundString::Builder<256U>::Builder
            ((Builder<256U> *)&nextSourcePosition,(ScriptContext *)thisObj_local);
  previousNumberOfCapturesToKeep._4_4_ = JavascriptString::GetLength(pJStack_20);
  previousNumberOfCapturesToKeep._0_4_ = 0;
  captures = (Type *)0x0;
  temptempAlloc = (TempArenaAllocatorObject *)0x0;
  tempAlloc = (ArenaAllocator *)
              ScriptContext::GetTemporaryAllocator((ScriptContext *)thisObj_local,L"RegexHelper");
  local_2e8 = TempArenaAllocatorWrapper<false>::GetAllocator
                        ((TempArenaAllocatorWrapper<false> *)tempAlloc);
  map.inputLength = (CharCount *)((long)&previousNumberOfCapturesToKeep + 4);
  map.scriptContext = (ScriptContext **)&thisObj_local;
  map.captures = (Type **)&temptempAlloc;
  map.recycler = (Recycler **)&results;
  map.previousNumberOfCapturesToKeep = (size_t *)&captures;
  map.nextSourcePosition = (CharCount *)&previousNumberOfCapturesToKeep;
  map.accumulatedResultBuilder = (Builder<256U> *)&nextSourcePosition;
  map.input = &stack0xffffffffffffffe0;
  map.appendReplacement = &appendReplacement;
  map.tempAlloc = &local_2e8;
  JsUtil::List<Js::RecyclableObject*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>::
  Map<Js::RegexHelper::RegexEs6ReplaceImpl<Js::RegexHelper::RegexEs6ReplaceImpl(Js::ScriptContext*,Js::RecyclableObject*,Js::JavascriptString*,Js::RecyclableObject*)::__0>(Js::ScriptContext*,Js::RecyclableObject*,Js::JavascriptString*,Js::RegexHelper::RegexEs6ReplaceImpl(Js::ScriptContext*,Js::RecyclableObject*,Js::JavascriptString*,Js::RecyclableObject*)::__0,bool)::_lambda(int,Js::RecyclableObject*)_1_>
            ((List<Js::RecyclableObject*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>
              *)local_40,map);
  ScriptContext::ReleaseTemporaryAllocator
            ((ScriptContext *)thisObj_local,(TempArenaAllocatorObject *)tempAlloc);
  if ((uint)previousNumberOfCapturesToKeep < previousNumberOfCapturesToKeep._4_4_) {
    CompoundString::Builder<256U>::Append
              ((Builder<256U> *)&nextSourcePosition,pJStack_20,(uint)previousNumberOfCapturesToKeep,
               previousNumberOfCapturesToKeep._4_4_ - (uint)previousNumberOfCapturesToKeep);
  }
  recycler = (Recycler *)
             CompoundString::Builder<256U>::ToString((Builder<256U> *)&nextSourcePosition);
  if (recycler == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                ,0x45f,"(accumulatedResult != nullptr)",
                                "accumulatedResult != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  return recycler;
}

Assistant:

Var RegexHelper::RegexEs6ReplaceImpl(ScriptContext* scriptContext, RecyclableObject* thisObj, JavascriptString* input, ReplacementFn appendReplacement, bool noResult)
    {
        bool global = JavascriptRegExp::GetGlobalProperty(thisObj, scriptContext);
        bool unicode = false; // Dummy value. It isn't used below unless "global" is "true".
        if (global)
        {
            unicode = JavascriptRegExp::GetUnicodeProperty(thisObj, scriptContext);
            JavascriptRegExp::SetLastIndexProperty(thisObj, TaggedInt::ToVarUnchecked(0), scriptContext);
        }

        JavascriptString* accumulatedResult = nullptr;

        Recycler* recycler = scriptContext->GetRecycler();

        JsUtil::List<RecyclableObject*>* results = RecyclerNew(recycler, JsUtil::List<RecyclableObject*>, recycler);

        while (true)
        {
            PCWSTR varName = _u("RegExp.prototype[Symbol.replace]");
            Var result = JavascriptRegExp::CallExec(thisObj, input, varName, scriptContext);
            if (JavascriptOperators::IsNull(result))
            {
                break;
            }

            RecyclableObject* resultObj = ExecResultToRecyclableObject(result);

            results->Add(resultObj);

            if (!global)
            {
                break;
            }

            JavascriptString* matchStr = GetMatchStrFromResult(resultObj, scriptContext);
            AdvanceLastIndex(thisObj, input, matchStr, unicode, scriptContext);
        }

        CompoundString::Builder<64 * sizeof(void *) / sizeof(char16)> accumulatedResultBuilder(scriptContext);
        CharCount inputLength = input->GetLength();
        CharCount nextSourcePosition = 0;

        size_t previousNumberOfCapturesToKeep = 0;
        Field(Var)* captures = nullptr;

        BEGIN_TEMP_ALLOCATOR(tempAlloc, scriptContext, _u("RegexHelper"))
        {
            results->Map([&](int resultIndex, RecyclableObject* resultObj) {
                int64 length = JavascriptConversion::ToLength(
                    JavascriptOperators::GetProperty(resultObj, PropertyIds::length, scriptContext),
                    scriptContext);
                uint64 numberOfCaptures = (uint64) max(length - 1, (int64) 0);

                JavascriptString* matchStr = GetMatchStrFromResult(resultObj, scriptContext);

                int64 index = JavascriptConversion::ToLength(
                    JavascriptOperators::GetProperty(resultObj, PropertyIds::index, scriptContext),
                    scriptContext);
                CharCount position = max(
                    min(JavascriptRegExp::GetIndexOrMax(index), inputLength),
                    (CharCount) 0);

                // Capture groups can be referenced using at most two digits.
                const uint64 maxNumberOfCaptures = 99;
                size_t numberOfCapturesToKeep = (size_t) min(numberOfCaptures, maxNumberOfCaptures);
                if (captures == nullptr)
                {
                    captures = RecyclerNewArray(recycler, Field(Var), numberOfCapturesToKeep + 1);
                }
                else if (numberOfCapturesToKeep != previousNumberOfCapturesToKeep)
                {
                    size_t existingBytes = (previousNumberOfCapturesToKeep + 1) * sizeof(Var*);
                    size_t requestedBytes = (numberOfCapturesToKeep + 1) * sizeof(Var*);
                    captures = (Field(Var)*) recycler->Realloc(captures, existingBytes, requestedBytes);
                }
                previousNumberOfCapturesToKeep = numberOfCapturesToKeep;

                for (uint64 i = 1; i <= numberOfCaptures; ++i)
                {
                    Var nextCapture = JavascriptOperators::GetItem(resultObj, i, scriptContext);
                    if (!JavascriptOperators::IsUndefined(nextCapture))
                    {
                        nextCapture = JavascriptConversion::ToString(nextCapture, scriptContext);
                    }

                    if (i <= numberOfCapturesToKeep)
                    {
                        captures[i] = nextCapture;
                    }
                }

                if (position >= nextSourcePosition)
                {
                    CharCount substringLength = position - nextSourcePosition;
                    accumulatedResultBuilder.Append(input, nextSourcePosition, substringLength);

                    appendReplacement(accumulatedResultBuilder, tempAlloc, matchStr, (int) numberOfCapturesToKeep, captures, position);

                    nextSourcePosition = JavascriptRegExp::AddIndex(position, matchStr->GetLength());
                }
            });
        }
        END_TEMP_ALLOCATOR(tempAlloc, scriptContext);

        if (nextSourcePosition < inputLength)
        {
            CharCount substringLength = inputLength - nextSourcePosition;
            accumulatedResultBuilder.Append(input, nextSourcePosition, substringLength);
        }

        accumulatedResult =  accumulatedResultBuilder.ToString();

        Assert(accumulatedResult != nullptr);
        return accumulatedResult;
    }